

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.cpp
# Opt level: O1

int tconcat(lua_State *L)

{
  int iVar1;
  uint uVar2;
  char *s;
  ulong uVar3;
  size_t sVar5;
  uint i;
  size_t lsep;
  luaL_Buffer b;
  size_t local_2048;
  luaL_Buffer local_2040;
  lua_Integer lVar4;
  
  s = luaL_optlstring(L,2,"",&local_2048);
  luaL_checktype(L,1,5);
  uVar3 = luaL_optinteger(L,3,1);
  i = (uint)uVar3;
  iVar1 = lua_type(L,4);
  if (iVar1 < 1) {
    sVar5 = lua_objlen(L,1);
    uVar2 = (uint)sVar5;
  }
  else {
    lVar4 = luaL_checkinteger(L,4);
    uVar2 = (uint)lVar4;
  }
  luaL_buffinit(L,&local_2040);
  if ((int)i < (int)uVar2) {
    do {
      addfield(L,&local_2040,(int)uVar3);
      luaL_addlstring(&local_2040,s,local_2048);
      i = (int)uVar3 + 1;
      uVar3 = (ulong)i;
    } while (uVar2 != i);
  }
  if (i == uVar2) {
    addfield(L,&local_2040,i);
  }
  luaL_pushresult(&local_2040);
  return 1;
}

Assistant:

static int tconcat (lua_State *L) {
  luaL_Buffer b;
  size_t lsep;
  int i, last;
  const char *sep = luaL_optlstring(L, 2, "", &lsep);
  luaL_checktype(L, 1, LUA_TTABLE);
  i = luaL_optint(L, 3, 1);
  last = luaL_opt(L, luaL_checkint, 4, luaL_getn(L, 1));
  luaL_buffinit(L, &b);
  for (; i < last; i++) {
    addfield(L, &b, i);
    luaL_addlstring(&b, sep, lsep);
  }
  if (i == last)  /* add last value (if interval was not empty) */
    addfield(L, &b, i);
  luaL_pushresult(&b);
  return 1;
}